

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_SUNMemory.cpp
# Opt level: O0

MemoryHelper * __thiscall
amrex::sundials::MemoryHelper::operator=(MemoryHelper *this,MemoryHelper *rhs)

{
  Context **in_RSI;
  MemoryHelper *in_RDI;
  
  std::swap<_SUNMemoryHelper*>(&in_RDI->helper,(_SUNMemoryHelper **)(in_RSI + 1));
  std::swap<sundials::Context*>(&in_RDI->sunctx,in_RSI);
  return in_RDI;
}

Assistant:

MemoryHelper& MemoryHelper::operator=(MemoryHelper rhs)
{
    std::swap(helper, rhs.helper);
    std::swap(sunctx, rhs.sunctx);
    return *this;
}